

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O2

uint llvm::reverseBits<unsigned_int>(uint Val)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  uchar uStack_9;
  uchar out [4];
  uchar in [4];
  
  pbVar2 = in;
  in = (uchar  [4])Val;
  lVar3 = 4;
  while (lVar3 != 0) {
    out[lVar3 + -1] = BitReverseTable256[*pbVar2];
    pbVar2 = pbVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  uVar1._0_1_ = out[0];
  uVar1._1_1_ = out[1];
  uVar1._2_1_ = out[2];
  uVar1._3_1_ = out[3];
  return uVar1;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}